

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exporter.cpp
# Opt level: O2

aiExportDataBlob * __thiscall
Assimp::Exporter::ExportToBlob
          (Exporter *this,aiScene *pScene,char *pFormatId,uint pPreprocessing,
          ExportProperties *pProperties)

{
  aiReturn aVar1;
  BlobIOSystem *__p;
  _Rb_tree_header *p_Var2;
  aiExportDataBlob *paVar3;
  ExporterPimpl *pEVar4;
  shared_ptr<Assimp::IOSystem> old;
  __shared_ptr<Assimp::IOSystem,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  pEVar4 = this->pimpl;
  if (pEVar4 != (ExporterPimpl *)0x0) {
    paVar3 = pEVar4->blob;
    if (paVar3 != (aiExportDataBlob *)0x0) {
      aiExportDataBlob::~aiExportDataBlob(paVar3);
      operator_delete(paVar3,0x420);
      this->pimpl->blob = (aiExportDataBlob *)0x0;
      pEVar4 = this->pimpl;
    }
    std::__shared_ptr<Assimp::IOSystem,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&old.super___shared_ptr<Assimp::IOSystem,_(__gnu_cxx::_Lock_policy)2>,
               &(pEVar4->mIOSystem).super___shared_ptr<Assimp::IOSystem,_(__gnu_cxx::_Lock_policy)2>
              );
    __p = (BlobIOSystem *)Intern::AllocateFromAssimpHeap::operator_new(0x68);
    (__p->super_IOSystem).m_pathStack.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__p->super_IOSystem).m_pathStack.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__p->super_IOSystem).m_pathStack.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__p->super_IOSystem)._vptr_IOSystem = (_func_int **)&PTR__BlobIOSystem_00758340;
    (__p->created)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    p_Var2 = &(__p->created)._M_t._M_impl.super__Rb_tree_header;
    (__p->created)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (__p->created)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    (__p->created)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    (__p->created)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    (__p->blobs).
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiExportDataBlob_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiExportDataBlob_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__p->blobs).
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiExportDataBlob_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiExportDataBlob_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__p->blobs).
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiExportDataBlob_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiExportDataBlob_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__shared_ptr<Assimp::IOSystem,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Assimp::BlobIOSystem,void>
              ((__shared_ptr<Assimp::IOSystem,(__gnu_cxx::_Lock_policy)2> *)&local_40,__p);
    std::__shared_ptr<Assimp::IOSystem,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->pimpl->mIOSystem).
                super___shared_ptr<Assimp::IOSystem,_(__gnu_cxx::_Lock_policy)2>,&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    aVar1 = Export(this,pScene,pFormatId,"$blobfile",pPreprocessing,pProperties);
    if (aVar1 == aiReturn_SUCCESS) {
      paVar3 = BlobIOSystem::GetBlobChain(__p);
      this->pimpl->blob = paVar3;
      std::__shared_ptr<Assimp::IOSystem,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->pimpl->mIOSystem).
                  super___shared_ptr<Assimp::IOSystem,_(__gnu_cxx::_Lock_policy)2>,
                 &old.super___shared_ptr<Assimp::IOSystem,_(__gnu_cxx::_Lock_policy)2>);
      paVar3 = this->pimpl->blob;
    }
    else {
      std::__shared_ptr<Assimp::IOSystem,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->pimpl->mIOSystem).
                  super___shared_ptr<Assimp::IOSystem,_(__gnu_cxx::_Lock_policy)2>,
                 &old.super___shared_ptr<Assimp::IOSystem,_(__gnu_cxx::_Lock_policy)2>);
      paVar3 = (aiExportDataBlob *)0x0;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&old.super___shared_ptr<Assimp::IOSystem,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    return paVar3;
  }
  __assert_fail("nullptr != pimpl",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/Exporter.cpp"
                ,0x129,
                "const aiExportDataBlob *Assimp::Exporter::ExportToBlob(const aiScene *, const char *, unsigned int, const ExportProperties *)"
               );
}

Assistant:

const aiExportDataBlob* Exporter::ExportToBlob( const aiScene* pScene, const char* pFormatId,
                                                unsigned int pPreprocessing, const ExportProperties* pProperties) {
	ai_assert(nullptr != pimpl);
    if (pimpl->blob) {
        delete pimpl->blob;
        pimpl->blob = nullptr;
    }

    std::shared_ptr<IOSystem> old = pimpl->mIOSystem;
    BlobIOSystem* blobio = new BlobIOSystem();
    pimpl->mIOSystem = std::shared_ptr<IOSystem>( blobio );

    if (AI_SUCCESS != Export(pScene,pFormatId,blobio->GetMagicFileName(), pPreprocessing, pProperties)) {
        pimpl->mIOSystem = old;
        return nullptr;
    }

    pimpl->blob = blobio->GetBlobChain();
    pimpl->mIOSystem = old;

    return pimpl->blob;
}